

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextcursor.cpp
# Opt level: O0

void __thiscall
QTextCursor::selectedTableCells
          (QTextCursor *this,int *firstRow,int *numRows,int *firstColumn,int *numColumns)

{
  int iVar1;
  bool bVar2;
  QTextCursorPrivate *pQVar3;
  undefined4 *in_RCX;
  int *in_RDX;
  int *in_RSI;
  int *in_RDI;
  undefined4 *in_R8;
  int *unaff_retaddr;
  QTextCursorPrivate *in_stack_00000008;
  
  *in_RSI = -1;
  *in_RCX = 0xffffffff;
  *in_RDX = -1;
  *in_R8 = 0xffffffff;
  bVar2 = QSharedDataPointer<QTextCursorPrivate>::operator!
                    ((QSharedDataPointer<QTextCursorPrivate> *)0x7a4b4c);
  if (!bVar2) {
    pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->
                       ((QSharedDataPointer<QTextCursorPrivate> *)0x7a4b5a);
    iVar1 = pQVar3->position;
    pQVar3 = QSharedDataPointer<QTextCursorPrivate>::operator->
                       ((QSharedDataPointer<QTextCursorPrivate> *)0x7a4b6b);
    if (iVar1 != pQVar3->anchor) {
      QSharedDataPointer<QTextCursorPrivate>::operator->
                ((QSharedDataPointer<QTextCursorPrivate> *)0x7a4b83);
      QTextCursorPrivate::selectedTableCells(in_stack_00000008,unaff_retaddr,in_RDI,in_RSI,in_RDX);
    }
  }
  return;
}

Assistant:

void QTextCursor::selectedTableCells(int *firstRow, int *numRows, int *firstColumn, int *numColumns) const
{
    *firstRow = -1;
    *firstColumn = -1;
    *numRows = -1;
    *numColumns = -1;

    if (!d || d->position == d->anchor)
        return;

    d->selectedTableCells(firstRow, numRows, firstColumn, numColumns);
}